

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O2

string * __thiscall
mnf::CartesianProduct::description
          (string *__return_storage_ptr__,CartesianProduct *this,string *prefix,bool firstCall)

{
  pointer psVar1;
  long *plVar2;
  char cVar3;
  ostream *poVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  long local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if ((int)CONCAT71(in_register_00000009,firstCall) == 0) {
    local_208 = 0;
    for (uVar5 = 0;
        psVar1 = (this->subManifolds_).
                 super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(this->subManifolds_).
                              super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
        uVar5 = uVar5 + 1) {
      cVar3 = (**(code **)(**(long **)((long)&(psVar1->
                                              super___shared_ptr<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + local_208) + 0x20))();
      if (cVar3 == '\0') {
        poVar4 = std::operator<<(local_1a8,(string *)prefix);
        poVar4 = std::operator<<(poVar4,"/cartprod--------------------------");
        std::endl<char,std::char_traits<char>>(poVar4);
        plVar2 = *(long **)((long)&(((this->subManifolds_).
                                     super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + local_208);
        std::operator+(&local_1f8,prefix,"| ");
        (**(code **)(*plVar2 + 0x28))(local_1d8,plVar2,&local_1f8,0);
        std::operator<<(local_1a8,local_1d8);
        std::__cxx11::string::~string(local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        poVar4 = std::operator<<(local_1a8,(string *)prefix);
        poVar4 = std::operator<<(poVar4,"\\----------------------------------");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      else {
        plVar2 = *(long **)((long)&(((this->subManifolds_).
                                     super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + local_208);
        (**(code **)(*plVar2 + 0x28))(local_1d8,plVar2,prefix,1);
        std::operator<<(local_1a8,local_1d8);
        std::__cxx11::string::~string(local_1d8);
      }
      local_208 = local_208 + 0x10;
    }
  }
  else {
    poVar4 = std::operator<<(local_1a8,(string *)prefix);
    poVar4 = std::operator<<(poVar4,"/cartprod--------------------------");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator+(&local_1f8,prefix,"| ");
    (*(this->super_Manifold)._vptr_Manifold[5])(local_1d8,this,&local_1f8,0);
    std::operator<<(local_1a8,local_1d8);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    poVar4 = std::operator<<(local_1a8,(string *)prefix);
    poVar4 = std::operator<<(poVar4,"\\----------------------------------");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string CartesianProduct::description(const std::string& prefix,
                                          bool firstCall) const
{
  std::stringstream ss;
  if (firstCall)
  {
    ss << prefix << "/cartprod--------------------------" << std::endl;
    ss << this->description(prefix + "| ", false);
    ss << prefix << "\\----------------------------------" << std::endl;
  }
  else
  {
    for (size_t i = 0; i < subManifolds_.size(); ++i)
    {
      if (subManifolds_[i]->isElementary())
      {
        ss << subManifolds_[i]->description(prefix);
      }
      else
      {
        ss << prefix << "/cartprod--------------------------" << std::endl;
        ss << subManifolds_[i]->description(prefix + "| ", false);
        ss << prefix << "\\----------------------------------" << std::endl;
      }
    }
  }
  return ss.str();
}